

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::NonPackedInt32::_InternalSerialize
          (NonPackedInt32 *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint size;
  void *data;
  bool bVar1;
  int iVar2;
  const_reference piVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  int index;
  byte *pbVar7;
  
  iVar2 = google::protobuf::internal::SooRep::size
                    ((SooRep *)&(this->field_0)._impl_,
                     (undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x4) ==
                     (undefined1  [24])0x0);
  if (0 < iVar2) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar3 = google::protobuf::RepeatedField<int>::Get
                         (&(this->field_0)._impl_.repeated_int32_,index);
      uVar4 = (ulong)*piVar3;
      pbVar7 = target + 3;
      target[0] = 0x80;
      target[1] = 0x80;
      target[2] = 1;
      uVar5 = uVar4;
      if (0x7f < uVar4) {
        do {
          *pbVar7 = (byte)uVar5 | 0x80;
          uVar4 = uVar5 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
      *pbVar7 = (byte)uVar4;
      target = pbVar7 + 1;
      index = index + 1;
    } while (index != iVar2);
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    uVar5 = uVar5 & 0xfffffffffffffffe;
    data = *(void **)(uVar5 + 8);
    size = *(uint *)(uVar5 + 0x10);
    if ((long)stream->end_ - (long)target < (long)(int)size) {
      puVar6 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar6;
    }
    memcpy(target,data,(ulong)size);
    target = target + (int)size;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL NonPackedInt32::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const NonPackedInt32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.NonPackedInt32)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 repeated_int32 = 2048;
  for (int i = 0, n = this_._internal_repeated_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        2048, this_._internal_repeated_int32().Get(i), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.NonPackedInt32)
  return target;
}